

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall
mkvparser::Segment::Segment
          (Segment *this,IMkvReader *pReader,longlong elem_start,longlong start,longlong size)

{
  this->m_pReader = pReader;
  this->m_element_start = elem_start;
  this->m_start = start;
  this->m_size = size;
  Cluster::Cluster(&this->m_eos);
  this->m_pos = start;
  this->m_pUnknownSize = (Cluster *)0x0;
  this->m_pSeekHead = (SeekHead *)0x0;
  this->m_pInfo = (SegmentInfo *)0x0;
  this->m_pTracks = (Tracks *)0x0;
  this->m_pCues = (Cues *)0x0;
  this->m_pChapters = (Chapters *)0x0;
  this->m_pTags = (Tags *)0x0;
  this->m_clusters = (Cluster **)0x0;
  this->m_clusterCount = 0;
  this->m_clusterPreloadCount = 0;
  this->m_clusterSize = 0;
  return;
}

Assistant:

Segment::Segment(IMkvReader* pReader, long long elem_start,
                 // long long elem_size,
                 long long start, long long size)
    : m_pReader(pReader),
      m_element_start(elem_start),
      // m_element_size(elem_size),
      m_start(start),
      m_size(size),
      m_pos(start),
      m_pUnknownSize(0),
      m_pSeekHead(NULL),
      m_pInfo(NULL),
      m_pTracks(NULL),
      m_pCues(NULL),
      m_pChapters(NULL),
      m_pTags(NULL),
      m_clusters(NULL),
      m_clusterCount(0),
      m_clusterPreloadCount(0),
      m_clusterSize(0) {}